

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

bool duckdb_yyjson::yyjson_mut_val_write_file
               (char *path,yyjson_mut_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,
               yyjson_write_err *err)

{
  char *pcVar1;
  undefined **in_RCX;
  char *in_RDI;
  yyjson_alc *in_R8;
  bool suc;
  yyjson_mut_val *root;
  usize dat_len;
  u8 *dat;
  yyjson_write_err dummy_err;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar2;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  yyjson_alc local_40;
  bool local_1;
  
  if (in_RCX == (undefined **)0x0) {
    in_RCX = &YYJSON_DEFAULT_ALC;
  }
  if (in_R8 == (yyjson_alc *)0x0) {
    in_R8 = &local_40;
  }
  bVar2 = 1;
  if (in_RDI != (char *)0x0) {
    bVar2 = *in_RDI != '\0' ^ 0xff;
  }
  local_40.free = (_func_void_void_ptr_void_ptr *)in_R8;
  if ((bVar2 & 1) == 0) {
    local_40.ctx = in_RCX;
    pcVar1 = yyjson_mut_val_write_opts
                       ((yyjson_mut_val *)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                        (yyjson_write_flag)((ulong)in_RCX >> 0x20),in_R8,
                        (usize *)CONCAT17(bVar2,in_stack_ffffffffffffff88),
                        (yyjson_write_err *)0x27dae44);
    if (pcVar1 == (char *)0x0) {
      local_1 = false;
    }
    else {
      bVar2 = write_dat_to_file((char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0
                                                ),(u8 *)in_RCX,(usize)in_R8,
                                (yyjson_write_err *)CONCAT17(bVar2,in_stack_ffffffffffffff88));
      (**(code **)((long)local_40.ctx + 0x10))(*(undefined **)((long)local_40.ctx + 0x18),pcVar1);
      local_1 = (bool)(bVar2 & 1);
    }
  }
  else {
    in_R8->realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)"input path is invalid";
    *(undefined4 *)(_func_void_ptr_void_ptr_size_t **)local_40.free = 1;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool yyjson_mut_val_write_file(const char *path,
                               const yyjson_mut_val *val,
                               yyjson_write_flag flg,
                               const yyjson_alc *alc_ptr,
                               yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    u8 *dat;
    usize dat_len = 0;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;
    bool suc;

    alc_ptr = alc_ptr ? alc_ptr : &YYJSON_DEFAULT_ALC;
    err = err ? err : &dummy_err;
    if (unlikely(!path || !*path)) {
        err->msg = "input path is invalid";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return false;
    }

    dat = (u8 *)yyjson_mut_val_write_opts(root, flg, alc_ptr, &dat_len, err);
    if (unlikely(!dat)) return false;
    suc = write_dat_to_file(path, dat, dat_len, err);
    alc_ptr->free(alc_ptr->ctx, dat);
    return suc;
}